

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  BYTE *pBVar9;
  int iVar10;
  ulong uVar11;
  BYTE *ip [4];
  U64 bits [4];
  BYTE *local_b8 [4];
  BYTE *local_98 [4];
  U64 local_78 [4];
  BYTE *local_58 [5];
  
  pvVar3 = args->dt;
  pBVar4 = args->ilimit;
  local_78[2] = args->bits[2];
  local_78[3] = args->bits[3];
  local_78[0] = args->bits[0];
  local_78[1] = args->bits[1];
  local_b8[0] = args->ip[0];
  local_b8[1] = args->ip[1];
  local_b8[2] = args->ip[2];
  local_b8[3] = args->ip[3];
  local_98[3] = args->op[3];
  local_98[0] = args->op[0];
  local_98[1] = args->op[1];
  local_98[2] = args->op[2];
  local_58[0] = args->op[1];
  local_58[1] = args->op[2];
  local_58[2] = local_98[3];
  local_58[3] = args->oend;
  do {
    lVar7 = 0;
    do {
      if (local_58[lVar7] < local_98[lVar7]) {
        __assert_fail("op[stream] <= oend[stream]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9210,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      if (local_b8[lVar7] < pBVar4) {
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9211,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar7 = 0;
    uVar11 = (ulong)((long)local_b8[0] - (long)pBVar4) / 7;
    do {
      uVar8 = (ulong)((long)local_58[lVar7] - (long)local_98[lVar7]) / 10;
      if (uVar11 < uVar8) {
        uVar8 = uVar11;
      }
      lVar7 = lVar7 + 1;
      uVar11 = uVar8;
    } while (lVar7 != 4);
    if ((((uVar8 < 2) || (local_b8[1] < local_b8[0])) || (local_b8[2] < local_b8[1])) ||
       (local_b8[3] < local_b8[2])) {
      args->bits[2] = local_78[2];
      args->bits[3] = local_78[3];
      args->bits[0] = local_78[0];
      args->bits[1] = local_78[1];
      args->ip[2] = local_b8[2];
      args->ip[3] = local_b8[3];
      args->ip[0] = local_b8[0];
      args->ip[1] = local_b8[1];
      args->op[2] = local_98[2];
      args->op[3] = local_98[3];
      args->op[0] = local_98[0];
      args->op[1] = local_98[1];
      return;
    }
    if (((local_b8[1] < local_b8[0]) || (local_b8[2] < local_b8[1])) || (local_b8[3] < local_b8[2]))
    {
      __assert_fail("ip[stream] >= ip[stream - 1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9240,
                    "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                   );
    }
    pBVar9 = local_98[3] + uVar8 * 5;
    iVar10 = 0;
    do {
      do {
        lVar7 = 0;
        do {
          uVar11 = local_78[lVar7];
          uVar8 = uVar11 >> 0x35;
          bVar1 = *(byte *)((long)pvVar3 + uVar8 * 4 + 2);
          bVar2 = *(byte *)((long)pvVar3 + uVar8 * 4 + 3);
          pBVar5 = local_98[lVar7];
          *(undefined2 *)pBVar5 = *(undefined2 *)((long)pvVar3 + uVar8 * 4);
          local_78[lVar7] = uVar11 << ((ulong)bVar1 & 0x3f);
          local_98[lVar7] = pBVar5 + bVar2;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 5);
      uVar11 = local_78[3] >> 0x35;
      bVar1 = *(byte *)((long)pvVar3 + uVar11 * 4 + 2);
      bVar2 = *(byte *)((long)pvVar3 + uVar11 * 4 + 3);
      *(undefined2 *)local_98[3] = *(undefined2 *)((long)pvVar3 + uVar11 * 4);
      local_78[3] = local_78[3] << ((ulong)bVar1 & 0x3f);
      local_98[3] = local_98[3] + bVar2;
      lVar7 = 0;
      do {
        uVar11 = local_78[3] >> 0x35;
        bVar1 = *(byte *)((long)pvVar3 + uVar11 * 4 + 2);
        bVar2 = *(byte *)((long)pvVar3 + uVar11 * 4 + 3);
        *(undefined2 *)local_98[3] = *(undefined2 *)((long)pvVar3 + uVar11 * 4);
        local_78[3] = local_78[3] << ((ulong)bVar1 & 0x3f);
        local_98[3] = local_98[3] + bVar2;
        uVar6 = 0;
        for (uVar11 = local_78[lVar7]; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
        {
          uVar6 = uVar6 + 1;
        }
        pBVar5 = local_b8[lVar7];
        local_b8[lVar7] = pBVar5 + -(ulong)(uVar6 >> 3);
        local_78[lVar7] = (*(ulong *)(pBVar5 + -(ulong)(uVar6 >> 3)) | 1) << ((byte)uVar6 & 7);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      iVar10 = 0;
    } while (local_98[3] < pBVar9);
  } while( true );
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilimit) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop if we are too close to the end. */
            if (op[3] + 10 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Do 5 table lookups for each of the first 3 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 3; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[stream], entry.sequence);
                    bits[stream] <<= (entry.nbBits);
                    op[stream] += (entry.length);
                }
            }
            /* Do 1 table lookup from the final stream */
            {
                int const index = (int)(bits[3] >> 53);
                HUF_DEltX2 const entry = dtable[index];
                MEM_write16(op[3], entry.sequence);
                bits[3] <<= (entry.nbBits);
                op[3] += (entry.length);
            }
            /* Do 4 table lookups from the final stream & reload bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                /* Do a table lookup from the final stream.
                 * This is interleaved with the reloading to reduce register
                 * pressure. This shouldn't be necessary, but compilers can
                 * struggle with codegen with high register pressure.
                 */
                {
                    int const index = (int)(bits[3] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[3], entry.sequence);
                    bits[3] <<= (entry.nbBits);
                    op[3] += (entry.length);
                }
                /* Reload the bistreams. The final bitstream must be reloaded
                 * after the 5th symbol was decoded.
                 */
                {
                    int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                    int const nbBits = ctz & 7;
                    int const nbBytes = ctz >> 3;
                    ip[stream] -= nbBytes;
                    bits[stream] = MEM_read64(ip[stream]) | 1;
                    bits[stream] <<= nbBits;
                }
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}